

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
count_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
           uint32_t *ibuff,size_t isize,size_t *maxv)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  pointer puVar6;
  ulong uVar7;
  size_t __n;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  undefined1 auVar12 [32];
  undefined1 auVar11 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar6 = (pointer)operator_new(0x1000);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = puVar6;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar6;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6 + 0x400;
  uVar8 = 0;
  memset(puVar6,0,0x1000);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar6 + 0x400;
  if (isize != 0) {
    sVar10 = 0;
    uVar8 = 0;
    do {
      uVar1 = ibuff[sVar10] + 1;
      uVar9 = (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      if ((ulong)((long)uVar9 >> 2) <= (ulong)uVar1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (__return_storage_ptr__,(ulong)(ibuff[sVar10] + 2));
        puVar6 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (long)(__return_storage_ptr__->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar6;
        __n = uVar7 - uVar9;
        if (uVar9 <= uVar7 && __n != 0) {
          memset((void *)((long)puVar6 + uVar9),0,__n);
        }
      }
      if (uVar8 <= uVar1) {
        uVar8 = uVar1;
      }
      puVar6 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar1;
      *puVar6 = *puVar6 + 1;
      sVar10 = sVar10 + 1;
    } while (isize != sVar10);
  }
  *maxv = (ulong)uVar8;
  if (uVar8 != 0) {
    uVar9 = 2;
    if (2 < uVar8 + 1) {
      uVar9 = (ulong)(uVar8 + 1);
    }
    auVar13 = vpbroadcastq_avx512f();
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    uVar7 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar15 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar18,auVar14);
      uVar5 = vpcmpuq_avx512f(auVar18,auVar13,2);
      auVar11 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                    ((__return_storage_ptr__->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1));
      auVar12._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar11._4_4_;
      auVar12._0_4_ = (uint)((byte)uVar5 & 1) * auVar11._0_4_;
      auVar12._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar11._8_4_;
      auVar12._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar11._12_4_;
      auVar12._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar11._16_4_;
      auVar12._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar11._20_4_;
      auVar12._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar11._24_4_;
      auVar12._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar11._28_4_;
      auVar18 = vpmovzxdq_avx512f(auVar12);
      auVar18 = vpaddq_avx512f(auVar15,auVar18);
      uVar7 = uVar7 + 8;
    } while ((uVar9 + 6 & 0xfffffffffffffff8) != uVar7);
    auVar18 = vmovdqa64_avx512f(auVar18);
    bVar2 = (bool)((byte)uVar5 & 1);
    auVar16._0_8_ = (ulong)bVar2 * auVar18._0_8_ | (ulong)!bVar2 * auVar15._0_8_;
    bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar16._8_8_ = (ulong)bVar2 * auVar18._8_8_ | (ulong)!bVar2 * auVar15._8_8_;
    bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar16._16_8_ = (ulong)bVar2 * auVar18._16_8_ | (ulong)!bVar2 * auVar15._16_8_;
    bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar16._24_8_ = (ulong)bVar2 * auVar18._24_8_ | (ulong)!bVar2 * auVar15._24_8_;
    bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar16._32_8_ = (ulong)bVar2 * auVar18._32_8_ | (ulong)!bVar2 * auVar15._32_8_;
    bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar16._40_8_ = (ulong)bVar2 * auVar18._40_8_ | (ulong)!bVar2 * auVar15._40_8_;
    bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar16._48_8_ = (ulong)bVar2 * auVar18._48_8_ | (ulong)!bVar2 * auVar15._48_8_;
    auVar16._56_8_ = (uVar5 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar15._56_8_;
    auVar11 = vextracti64x4_avx512f(auVar16,1);
    auVar18 = vpaddq_avx512f(auVar16,ZEXT3264(auVar11));
    auVar3 = vpaddq_avx(auVar18._0_16_,auVar18._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    if (0x20000000000 < auVar3._0_8_) {
      puVar6 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar11 = vpcmpeqd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar3));
      do {
        auVar18 = ZEXT1664((undefined1  [16])0x0);
        uVar7 = 0;
        do {
          auVar15 = vmovdqa64_avx512f(auVar18);
          auVar18 = vpbroadcastq_avx512f();
          auVar18 = vporq_avx512f(auVar18,auVar14);
          uVar5 = vpcmpuq_avx512f(auVar18,auVar13,2);
          auVar12 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(puVar6 + uVar7 + 1));
          auVar19._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar12._4_4_;
          auVar19._0_4_ = (uint)((byte)uVar5 & 1) * auVar12._0_4_;
          auVar19._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar12._8_4_;
          auVar19._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar12._12_4_;
          auVar19._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar12._16_4_;
          auVar19._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar12._20_4_;
          auVar19._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar12._24_4_;
          auVar19._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar12._28_4_;
          auVar12 = vpsubd_avx2(auVar19,auVar11);
          auVar19 = vpsrld_avx2(auVar12,1);
          auVar12 = vmovdqu32_avx512vl(auVar19);
          *(undefined1 (*) [32])(puVar6 + uVar7 + 1) = auVar12;
          auVar18 = vpmovzxdq_avx512f(auVar19);
          auVar18 = vpaddq_avx512f(auVar15,auVar18);
          uVar7 = uVar7 + 8;
        } while ((uVar9 + 6 & 0x1fffffff8) != uVar7);
        auVar18 = vmovdqa64_avx512f(auVar18);
        bVar2 = (bool)((byte)uVar5 & 1);
        auVar17._0_8_ = (ulong)bVar2 * auVar18._0_8_ | (ulong)!bVar2 * auVar15._0_8_;
        bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
        auVar17._8_8_ = (ulong)bVar2 * auVar18._8_8_ | (ulong)!bVar2 * auVar15._8_8_;
        bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
        auVar17._16_8_ = (ulong)bVar2 * auVar18._16_8_ | (ulong)!bVar2 * auVar15._16_8_;
        bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
        auVar17._24_8_ = (ulong)bVar2 * auVar18._24_8_ | (ulong)!bVar2 * auVar15._24_8_;
        bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
        auVar17._32_8_ = (ulong)bVar2 * auVar18._32_8_ | (ulong)!bVar2 * auVar15._32_8_;
        bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
        auVar17._40_8_ = (ulong)bVar2 * auVar18._40_8_ | (ulong)!bVar2 * auVar15._40_8_;
        bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
        auVar17._48_8_ = (ulong)bVar2 * auVar18._48_8_ | (ulong)!bVar2 * auVar15._48_8_;
        auVar17._56_8_ =
             (uVar5 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar15._56_8_;
        auVar12 = vextracti64x4_avx512f(auVar17,1);
        auVar18 = vpaddq_avx512f(auVar17,ZEXT3264(auVar12));
        auVar3 = vpaddq_avx(auVar18._0_16_,auVar18._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpaddq_avx(auVar3,auVar4);
      } while (0x20000000000 < auVar3._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> count_freqs(
    const uint32_t* ibuff, size_t isize, size_t* maxv)
{
    uint32_t newmax = 0;
    std::vector<uint32_t> F(1024, 0);
    for (size_t i = 0; i < isize; i++) {
        uint32_t v = ibuff[i] + 1;
        if (v >= F.size()) {
            auto cur_size = F.size();
            F.resize(v + 1);
            for (size_t j = cur_size; j < F.size(); j++)
                F[j] = 0;
        }
        newmax = std::max(newmax, v);
        F[v]++;
    }
    *maxv = newmax;
    size_t total = 0;
    for (uint32_t i = 1; i <= newmax; i++) {
        total += F[i];
    }

    /* now downsample the frequency array if required, to ensure that
       total size is less than 2^28
    */
    while (total > MINR) {
        total = 0;
        for (uint32_t i = 1; i <= newmax; i++) {
            F[i] = (F[i] + 1) >> 1;
            total += F[i];
        }
    }
    /* return the array that got constructed */
    return F;
}